

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int get_archive_comment(int argc,char **argv)

{
  uint local_24;
  long lStack_20;
  int len;
  char *comment;
  char **argv_local;
  int argc_local;
  
  comment = (char *)argv;
  argv_local._4_4_ = argc;
  lStack_20 = zip_get_archive_comment(za,&local_24,0);
  if (lStack_20 == 0) {
    printf("No archive comment\n");
  }
  else {
    printf("Archive comment: %.*s\n",(ulong)local_24,lStack_20);
  }
  return 0;
}

Assistant:

static int
get_archive_comment(int argc, char *argv[]) {
    const char *comment;
    int len;
    /* get archive comment */
    if ((comment = zip_get_archive_comment(za, &len, 0)) == NULL)
	printf("No archive comment\n");
    else
	printf("Archive comment: %.*s\n", len, comment);
    return 0;
}